

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O0

void nk_glfw3_render(nk_anti_aliasing AA,int max_vertex_buffer,int max_element_buffer)

{
  void *pvVar1;
  void *vertices;
  nk_convert_config config;
  nk_buffer ebuf;
  nk_buffer vbuf;
  nk_draw_index *offset;
  nk_draw_command *cmd;
  size_t vc;
  size_t vt;
  size_t vp;
  GLsizei vs;
  nk_glfw_device *dev;
  int max_element_buffer_local;
  int max_vertex_buffer_local;
  nk_anti_aliasing AA_local;
  
  (*glad_glPushAttrib)(0x7000);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glEnable)(0xc11);
  (*glad_glEnable)(0xbe2);
  (*glad_glEnable)(0xde1);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glViewport)(0,0,glfw.display_width,glfw.display_height);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glPushMatrix)();
  (*glad_glLoadIdentity)();
  (*glad_glOrtho)(0.0,(double)glfw.width,(double)glfw.height,0.0,-1.0,1.0);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glPushMatrix)();
  (*glad_glLoadIdentity)();
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8078);
  (*glad_glEnableClientState)(0x8076);
  nk_memset(&vertices,0,0x40);
  config.null.uv = (nk_vec2)nk_glfw3_render::vertex_layout;
  config.vertex_layout = (nk_draw_vertex_layout_element *)0x14;
  config.vertex_size = 4;
  config._16_8_ = glfw.ogl.null.texture;
  config.null.texture = (nk_handle)glfw.ogl.null.uv;
  config.line_AA = 0x16;
  config.circle_segment_count = 0x16;
  config.shape_AA = 0x16;
  vertices._0_4_ = 0x3f800000;
  vertices._4_4_ = AA;
  config.global_alpha = (float)AA;
  nk_buffer_init_default((nk_buffer *)&ebuf.size);
  nk_buffer_init_default((nk_buffer *)&config.vertex_alignment);
  nk_convert(&glfw.ctx,&glfw.ogl.cmds,(nk_buffer *)&ebuf.size,(nk_buffer *)&config.vertex_alignment,
             (nk_convert_config *)&vertices);
  pvVar1 = nk_buffer_memory_const((nk_buffer *)&ebuf.size);
  (*glad_glVertexPointer)(2,0x1406,0x14,pvVar1);
  (*glad_glTexCoordPointer)(2,0x1406,0x14,(void *)((long)pvVar1 + 8));
  (*glad_glColorPointer)(4,0x1401,0x14,(void *)((long)pvVar1 + 0x10));
  vbuf.size = (nk_size)nk_buffer_memory_const((nk_buffer *)&config.vertex_alignment);
  for (offset = (nk_draw_index *)nk__draw_begin(&glfw.ctx,&glfw.ogl.cmds);
      offset != (nk_draw_index *)0x0;
      offset = (nk_draw_index *)nk__draw_next((nk_draw_command *)offset,&glfw.ogl.cmds,&glfw.ctx)) {
    if (*(int *)offset != 0) {
      (*glad_glBindTexture)(0xde1,*(GLuint *)(offset + 0xc));
      (*glad_glScissor)((int)(*(float *)(offset + 2) * glfw.fb_scale.x),
                        (int)((float)(glfw.height -
                                     (int)(*(float *)(offset + 4) + *(float *)(offset + 8))) *
                             glfw.fb_scale.y),(int)(*(float *)(offset + 6) * glfw.fb_scale.x),
                        (int)(*(float *)(offset + 8) * glfw.fb_scale.y));
      (*glad_glDrawElements)(4,*(GLsizei *)offset,0x1403,(void *)vbuf.size);
      vbuf.size = vbuf.size + (ulong)*(uint *)offset * 2;
    }
  }
  nk_clear(&glfw.ctx);
  nk_buffer_free((nk_buffer *)&ebuf.size);
  nk_buffer_free((nk_buffer *)&config.vertex_alignment);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8078);
  (*glad_glDisableClientState)(0x8076);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glDisable)(0xc11);
  (*glad_glDisable)(0xbe2);
  (*glad_glDisable)(0xde1);
  (*glad_glBindTexture)(0xde1,0);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glPopMatrix)();
  (*glad_glMatrixMode)(0x1701);
  (*glad_glPopMatrix)();
  (*glad_glPopAttrib)();
  return;
}

Assistant:

NK_API void
nk_glfw3_render(enum nk_anti_aliasing AA, int max_vertex_buffer, int max_element_buffer)
{
    /* setup global state */
    struct nk_glfw_device *dev = &glfw.ogl;
    glPushAttrib(GL_ENABLE_BIT|GL_COLOR_BUFFER_BIT|GL_TRANSFORM_BIT);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
    glEnable(GL_BLEND);
    glEnable(GL_TEXTURE_2D);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

    /* setup viewport/project */
    glViewport(0,0,(GLsizei)glfw.display_width,(GLsizei)glfw.display_height);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
    glOrtho(0.0f, glfw.width, glfw.height, 0.0f, -1.0f, 1.0f);
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();

    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_TEXTURE_COORD_ARRAY);
    glEnableClientState(GL_COLOR_ARRAY);
    {
        GLsizei vs = sizeof(struct nk_glfw_vertex);
        size_t vp = offsetof(struct nk_glfw_vertex, position);
        size_t vt = offsetof(struct nk_glfw_vertex, uv);
        size_t vc = offsetof(struct nk_glfw_vertex, col);

        /* convert from command queue into draw list and draw to screen */
        const struct nk_draw_command *cmd;
        const nk_draw_index *offset = NULL;
        struct nk_buffer vbuf, ebuf;

        /* fill convert configuration */
        struct nk_convert_config config;
        static const struct nk_draw_vertex_layout_element vertex_layout[] = {
            {NK_VERTEX_POSITION, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, position)},
            {NK_VERTEX_TEXCOORD, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, uv)},
            {NK_VERTEX_COLOR, NK_FORMAT_R8G8B8A8, NK_OFFSETOF(struct nk_glfw_vertex, col)},
            {NK_VERTEX_LAYOUT_END}
        };
        NK_MEMSET(&config, 0, sizeof(config));
        config.vertex_layout = vertex_layout;
        config.vertex_size = sizeof(struct nk_glfw_vertex);
        config.vertex_alignment = NK_ALIGNOF(struct nk_glfw_vertex);
        config.null = dev->null;
        config.circle_segment_count = 22;
        config.curve_segment_count = 22;
        config.arc_segment_count = 22;
        config.global_alpha = 1.0f;
        config.shape_AA = AA;
        config.line_AA = AA;

        /* convert shapes into vertexes */
        nk_buffer_init_default(&vbuf);
        nk_buffer_init_default(&ebuf);
        nk_convert(&glfw.ctx, &dev->cmds, &vbuf, &ebuf, &config);

        /* setup vertex buffer pointer */
        {const void *vertices = nk_buffer_memory_const(&vbuf);
        glVertexPointer(2, GL_FLOAT, vs, (const void*)((const nk_byte*)vertices + vp));
        glTexCoordPointer(2, GL_FLOAT, vs, (const void*)((const nk_byte*)vertices + vt));
        glColorPointer(4, GL_UNSIGNED_BYTE, vs, (const void*)((const nk_byte*)vertices + vc));}

        /* iterate over and execute each draw command */
        offset = (const nk_draw_index*)nk_buffer_memory_const(&ebuf);
        nk_draw_foreach(cmd, &glfw.ctx, &dev->cmds)
        {
            if (!cmd->elem_count) continue;
            glBindTexture(GL_TEXTURE_2D, (GLuint)cmd->texture.id);
            glScissor(
                (GLint)(cmd->clip_rect.x * glfw.fb_scale.x),
                (GLint)((glfw.height - (GLint)(cmd->clip_rect.y + cmd->clip_rect.h)) * glfw.fb_scale.y),
                (GLint)(cmd->clip_rect.w * glfw.fb_scale.x),
                (GLint)(cmd->clip_rect.h * glfw.fb_scale.y));
            glDrawElements(GL_TRIANGLES, (GLsizei)cmd->elem_count, GL_UNSIGNED_SHORT, offset);
            offset += cmd->elem_count;
        }
        nk_clear(&glfw.ctx);
        nk_buffer_free(&vbuf);
        nk_buffer_free(&ebuf);
    }

    /* default OpenGL state */
    glDisableClientState(GL_VERTEX_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_COLOR_ARRAY);

    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_SCISSOR_TEST);
    glDisable(GL_BLEND);
    glDisable(GL_TEXTURE_2D);

    glBindTexture(GL_TEXTURE_2D, 0);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
}